

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

TestResult *
test_one<short>(TestResult *__return_storage_ptr__,random_numerators<short> *vals,short denom)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  uint64_t uVar10;
  pFuncToTime<short,_short> extraout_RDX;
  ulong uVar11;
  ushort uVar12;
  divider<short,_(libdivide::Branching)0> denom_00;
  divider<short,_(libdivide::Branching)1> denom_01;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM5 [16];
  time_double tVar19;
  time_double tVar20;
  time_double tVar21;
  timer t;
  ulong local_90;
  ulong local_88;
  undefined1 local_78 [16];
  timeval local_58;
  timeval local_48;
  pFuncToTime<short,_short> timeFunc;
  
  if (denom != 0) {
    uVar12 = -denom;
    if (0 < denom) {
      uVar12 = denom;
    }
    uVar5 = (ushort)LZCOUNT(uVar12) ^ 0xf;
    if ((uVar12 - 1 & uVar12) == 0) {
      uVar5 = uVar5 | (byte)((ushort)denom >> 8) & 0x80;
      uVar3 = 0;
    }
    else {
      uVar2 = (uint)(0x8000 << uVar5) / (uint)uVar12;
      iVar8 = uVar2 * uVar12;
      if (((uint)uVar12 + iVar8 & 0xffff) >> uVar5 == 0) {
        bVar4 = 0xe - (char)LZCOUNT(uVar12);
      }
      else {
        sVar1 = (short)iVar8;
        bVar4 = (byte)uVar5 | 0x40;
        uVar2 = (uint)(0 < sVar1 || uVar12 <= (ushort)(sVar1 * -2)) + uVar2 * 2;
      }
      uVar3 = ~uVar2;
      if (-1 < denom) {
        uVar3 = uVar2 + 1;
      }
      uVar5 = (uint)(bVar4 | 0x80);
      if (-1 < denom) {
        uVar5 = (uint)bVar4;
      }
    }
    uVar2 = 2;
    if (denom != 1) {
      uVar2 = (uint)(ushort)denom;
    }
    uVar7 = (ushort)uVar2;
    uVar12 = -uVar7;
    if (0 < (short)uVar7) {
      uVar12 = uVar7;
    }
    uVar13 = (ushort)LZCOUNT(uVar12) ^ 0xf;
    uVar9 = uVar12 - 1 & (uint)uVar12;
    timeFunc = (pFuncToTime<short,_short>)(ulong)uVar9;
    if (uVar9 == 0) {
      uVar13 = uVar13 | uVar2 >> 8 & 0x80;
      iVar8 = 0;
    }
    else {
      uVar2 = (uint)(0x8000 << uVar13) / (uint)uVar12;
      sVar1 = uVar12 * (short)uVar2;
      bVar6 = 0 < sVar1 || uVar12 <= (ushort)(sVar1 * -2);
      timeFunc = (pFuncToTime<short,_short>)(ulong)bVar6;
      uVar13 = (uint)(byte)(((-1 < (short)uVar7) << 7 | (byte)uVar13) - 0x40);
      iVar8 = bVar6 + 1 + uVar2 * 2;
    }
    denom_00.div.denom = (dispatcher_t)((int3)uVar5 * 0x10000 + ((uint3)uVar3 & 0xffff));
    uVar11 = 0x7fffffffffffffff;
    lVar15 = 0x1e;
    uVar14 = 0x7fffffffffffffff;
    local_88 = 0x7fffffffffffffff;
    local_90 = 0x7fffffffffffffff;
    denom_01.div.denom = (dispatcher_t)((uint3)iVar8 & 0xffff | (uint3)(uVar13 << 0x10));
    local_78._8_8_ = 0x7fffffffffffffff;
    local_78._0_8_ = 0x7fffffffffffffff;
    do {
      tVar19 = time_function<short,short>(vals,denom,timeFunc);
      uVar10 = tVar19.result;
      tVar20 = time_function<short,libdivide::divider<short,(libdivide::Branching)0>>
                         (vals,denom_00,
                          sum_quotients<short,libdivide::divider<short,(libdivide::Branching)0>>);
      if (uVar10 != tVar20.result) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failure on line ",0x10);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      }
      if (denom != 1) {
        tVar21 = time_function<short,libdivide::divider<short,(libdivide::Branching)1>>
                           (vals,denom_01,
                            sum_quotients<short,libdivide::divider<short,(libdivide::Branching)1>>);
        if (tVar21.time < local_90) {
          local_90 = tVar21.time;
        }
        if (uVar10 != tVar21.result) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failure on line ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        }
      }
      tVar21 = time_function<short,libdivide::divider<short,(libdivide::Branching)0>>
                         (vals,denom_00,
                          sum_quotients_vec<short,libdivide::divider<short,(libdivide::Branching)0>>
                         );
      if (tVar21.time < uVar14) {
        uVar14 = tVar21.time;
      }
      if (uVar10 != tVar21.result) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failure on line ",0x10);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      }
      if (denom != 1) {
        tVar21 = time_function<short,libdivide::divider<short,(libdivide::Branching)1>>
                           (vals,denom_01,
                            sum_quotients_vec<short,libdivide::divider<short,(libdivide::Branching)1>>
                           );
        if (tVar21.time < local_88) {
          local_88 = tVar21.time;
        }
        if (uVar10 != tVar21.result) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failure on line ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        }
      }
      auVar17._8_8_ = 0;
      auVar17._0_8_ = tVar20.time;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = tVar19.time;
      auVar17 = vpunpcklqdq_avx(auVar16,auVar17);
      local_78 = vpminuq_avx512vl(auVar17,local_78);
      gettimeofday(&local_58,(__timezone_ptr_t)0x0);
      generate_divisor<short>(vals,denom);
      gettimeofday(&local_48,(__timezone_ptr_t)0x0);
      auVar17 = vpsubq_avx((undefined1  [16])local_48,(undefined1  [16])local_58);
      auVar16 = vpmullq_avx512vl(auVar17,_DAT_00107020);
      auVar17 = vpshufd_avx(auVar16,0xee);
      auVar17 = vpaddq_avx(auVar17,auVar16);
      if (auVar17._0_8_ < uVar11) {
        uVar11 = auVar17._0_8_;
      }
      lVar15 = lVar15 + -1;
      timeFunc = extraout_RDX;
    } while (lVar15 != 0);
    auVar17 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,vals->_length);
    bVar6 = denom == 1;
    auVar18._0_8_ = auVar17._0_8_;
    __return_storage_ptr__->gen_time = (double)(long)uVar11 / auVar18._0_8_;
    auVar17 = vcvtuqq2pd_avx512vl(local_78);
    auVar16 = vcvtusi2sd_avx512f(in_XMM5,uVar14);
    __return_storage_ptr__->branchfree_time =
         (double)((ulong)bVar6 * -0x4010000000000000 +
                 (ulong)!bVar6 * (long)((double)(long)local_90 / auVar18._0_8_));
    auVar18._8_8_ = auVar18._0_8_;
    auVar17 = vdivpd_avx(auVar17,auVar18);
    __return_storage_ptr__->vector_time = auVar16._0_8_ / auVar18._0_8_;
    __return_storage_ptr__->vector_branchfree_time =
         (double)((ulong)bVar6 * -0x4010000000000000 +
                 (ulong)!bVar6 * (long)((double)(long)local_88 / auVar18._0_8_));
    __return_storage_ptr__->hardware_time = (double)auVar17._0_8_;
    __return_storage_ptr__->base_time = (double)auVar17._8_8_;
    return __return_storage_ptr__;
  }
  fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x4fb,"libdivide_internal_s16_gen",
          "divider must be != 0");
  abort();
}

Assistant:

NOINLINE TestResult test_one(const random_numerators<IntT> &vals, IntT denom) {
    const bool testBranchfree = (denom != 1);
    divider<IntT, BRANCHFULL> div_bfull(denom);
    divider<IntT, BRANCHFREE> div_bfree(testBranchfree ? denom : 2);

    uint64_t min_my_time = INT64_MAX, min_my_time_branchfree = INT64_MAX,
             min_my_time_vector = INT64_MAX, min_my_time_vector_branchfree = INT64_MAX,
             min_his_time = INT64_MAX, min_gen_time = INT64_MAX;
    time_double tresult;
    for (size_t iter = 0; iter < TEST_COUNT; iter++) {
        tresult = time_function(vals, denom, sum_quotients);
        min_his_time = (std::min)(min_his_time, tresult.time);
        const uint64_t expected = tresult.result;

        tresult = time_function(vals, div_bfull, sum_quotients);
        min_my_time = (std::min)(min_my_time, tresult.time);
        check_result(tresult.result, expected, __LINE__);

        if (testBranchfree) {
            tresult = time_function(vals, div_bfree, sum_quotients);
            min_my_time_branchfree = (std::min)(min_my_time_branchfree, tresult.time);
            check_result(tresult.result, expected, __LINE__);
        }

#if defined(x86_VECTOR_TYPE) || defined(LIBDIVIDE_NEON)
        tresult = time_function(vals, div_bfull, sum_quotients_vec);
        min_my_time_vector = (std::min)(min_my_time_vector, tresult.time);
        check_result(tresult.result, expected, __LINE__);

        if (testBranchfree) {
            tresult = time_function(vals, div_bfree, sum_quotients_vec);
            min_my_time_vector_branchfree = (std::min)(min_my_time_vector_branchfree, tresult.time);
            check_result(tresult.result, expected, __LINE__);
        }
#else
        min_my_time_vector = 0;
        min_my_time_vector_branchfree = 0;
#endif

        {
            timer t;
            t.start();
            generate_divisor(vals, denom);
            t.stop();
            min_gen_time = (std::min)(min_gen_time, t.duration_nano());
        }
    }

    TestResult result;
    result.gen_time = min_gen_time / (double)vals.length();
    result.base_time = min_my_time / (double)vals.length();
    result.branchfree_time = testBranchfree ? min_my_time_branchfree / (double)vals.length() : -1;
    result.vector_time = min_my_time_vector / (double)vals.length();
    result.vector_branchfree_time =
        testBranchfree ? min_my_time_vector_branchfree / (double)vals.length() : -1;
    result.hardware_time = min_his_time / (double)vals.length();
    return result;
}